

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int do_sign(EVP_PKEY *key,ptls_buffer_t *outbuf,ptls_iovec_t input,EVP_MD *md)

{
  int iVar1;
  EVP_MD *pEVar2;
  int local_4c;
  size_t sStack_48;
  int ret;
  size_t siglen;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_MD_CTX *ctx;
  EVP_MD *md_local;
  ptls_buffer_t *outbuf_local;
  EVP_PKEY *key_local;
  ptls_iovec_t input_local;
  
  input_local.base = (uint8_t *)input.len;
  key_local = (EVP_PKEY *)input.base;
  pkey_ctx = (EVP_PKEY_CTX *)0x0;
  ctx = (EVP_MD_CTX *)md;
  md_local = (EVP_MD *)outbuf;
  outbuf_local = (ptls_buffer_t *)key;
  pkey_ctx = (EVP_PKEY_CTX *)EVP_MD_CTX_new();
  if ((EVP_MD_CTX *)pkey_ctx == (EVP_MD_CTX *)0x0) {
    local_4c = 0x201;
  }
  else {
    iVar1 = EVP_DigestSignInit((EVP_MD_CTX *)pkey_ctx,(EVP_PKEY_CTX **)&siglen,(EVP_MD *)ctx,
                               (ENGINE *)0x0,(EVP_PKEY *)outbuf_local);
    if (iVar1 == 1) {
      iVar1 = EVP_PKEY_get_id(outbuf_local);
      if (iVar1 == 6) {
        iVar1 = EVP_PKEY_CTX_set_rsa_padding(siglen,6);
        if (iVar1 != 1) {
          local_4c = 0x203;
          goto LAB_0010b487;
        }
        iVar1 = EVP_PKEY_CTX_set_rsa_pss_saltlen(siglen,0xffffffff);
        if (iVar1 != 1) {
          local_4c = 0x203;
          goto LAB_0010b487;
        }
        pEVar2 = EVP_sha256();
        iVar1 = EVP_PKEY_CTX_set_rsa_mgf1_md(siglen,pEVar2);
        if (iVar1 != 1) {
          local_4c = 0x203;
          goto LAB_0010b487;
        }
      }
      iVar1 = EVP_DigestSignUpdate(pkey_ctx,key_local,input_local.base);
      if (iVar1 == 1) {
        iVar1 = EVP_DigestSignFinal((EVP_MD_CTX *)pkey_ctx,(uchar *)0x0,&stack0xffffffffffffffb8);
        if (iVar1 == 1) {
          local_4c = ptls_buffer_reserve((ptls_buffer_t *)md_local,sStack_48);
          if (local_4c == 0) {
            iVar1 = EVP_DigestSignFinal((EVP_MD_CTX *)pkey_ctx,
                                        (uchar *)(*(long *)md_local + *(long *)(md_local + 0x10)),
                                        &stack0xffffffffffffffb8);
            if (iVar1 == 1) {
              *(size_t *)(md_local + 0x10) = sStack_48 + *(long *)(md_local + 0x10);
              local_4c = 0;
            }
            else {
              local_4c = 0x203;
            }
          }
        }
        else {
          local_4c = 0x203;
        }
      }
      else {
        local_4c = 0x203;
      }
    }
    else {
      local_4c = 0x203;
    }
  }
LAB_0010b487:
  if (pkey_ctx != (EVP_PKEY_CTX *)0x0) {
    EVP_MD_CTX_free(pkey_ctx);
  }
  return local_4c;
}

Assistant:

static int do_sign(EVP_PKEY *key, ptls_buffer_t *outbuf, ptls_iovec_t input, const EVP_MD *md)
{
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx;
    size_t siglen;
    int ret;

    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_DigestSignInit(ctx, &pkey_ctx, md, NULL, key) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
        if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, EVP_sha256()) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    }
    if (EVP_DigestSignUpdate(ctx, input.base, input.len) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_DigestSignFinal(ctx, NULL, &siglen) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((ret = ptls_buffer_reserve(outbuf, siglen)) != 0)
        goto Exit;
    if (EVP_DigestSignFinal(ctx, outbuf->base + outbuf->off, &siglen) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    outbuf->off += siglen;

    ret = 0;
Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    return ret;
}